

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_module.cpp
# Opt level: O0

shared_ptr<TestBaseType> more_derived_type_factory(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<TestBaseType> sVar1;
  shared_ptr<TestMoreDerivedType> local_20;
  
  std::make_shared<TestMoreDerivedType>();
  std::shared_ptr<TestBaseType>::shared_ptr<TestMoreDerivedType,void>
            ((shared_ptr<TestBaseType> *)in_RDI,&local_20);
  std::shared_ptr<TestMoreDerivedType>::~shared_ptr(&local_20);
  sVar1.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<TestBaseType>)
         sVar1.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TestBaseType> more_derived_type_factory() {
  return std::make_shared<TestMoreDerivedType>();
}